

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O0

void __thiscall
cmMakefile::AddCacheDefinition
          (cmMakefile *this,string *name,char *value,char *doc,CacheEntryType type,bool force)

{
  bool bVar1;
  CacheEntryType CVar2;
  cmState *pcVar3;
  char *pcVar4;
  pointer pbVar5;
  reference pvVar6;
  cmake *pcVar7;
  char *local_168;
  char *local_e8;
  string local_d8;
  allocator local_b1;
  string local_b0 [8];
  string nvalue;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  files;
  size_type cc;
  char *existingValue;
  allocator local_51;
  undefined1 local_50 [8];
  string val;
  bool haveVal;
  bool force_local;
  CacheEntryType type_local;
  char *doc_local;
  char *value_local;
  string *name_local;
  cmMakefile *this_local;
  
  val.field_2._M_local_buf[10] = -(value != (char *)0x0) & 1;
  local_e8 = value;
  if (val.field_2._M_local_buf[10] == 0) {
    local_e8 = "";
  }
  val.field_2._M_local_buf[0xb] = force;
  val.field_2._12_4_ = type;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)local_50,local_e8,&local_51);
  std::allocator<char>::~allocator((allocator<char> *)&local_51);
  pcVar3 = GetState(this);
  pcVar4 = cmState::GetInitializedCacheValue(pcVar3,name);
  if (pcVar4 != (char *)0x0) {
    pcVar3 = GetState(this);
    CVar2 = cmState::GetCacheEntryType(pcVar3,name);
    if (CVar2 == UNINITIALIZED) {
      if ((val.field_2._M_local_buf[0xb] & 1U) == 0) {
        std::__cxx11::string::operator=((string *)local_50,pcVar4);
        val.field_2._M_local_buf[10] = '\x01';
      }
      if ((val.field_2._12_4_ == 1) || (val.field_2._12_4_ == 2)) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)((long)&nvalue.field_2 + 8));
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_b0,"",&local_b1);
        std::allocator<char>::~allocator((allocator<char> *)&local_b1);
        cmSystemTools::ExpandListArgument
                  ((string *)local_50,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)((long)&nvalue.field_2 + 8),false);
        for (files.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            pbVar5 = (pointer)std::
                              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      *)((long)&nvalue.field_2 + 8)),
            files.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage < pbVar5;
            files.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage =
                 (pointer)&(files.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage)->field_0x1) {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)((long)&nvalue.field_2 + 8),
                       (size_type)
                       files.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
          pcVar4 = (char *)std::__cxx11::string::c_str();
          bVar1 = cmSystemTools::IsOff(pcVar4);
          if (!bVar1) {
            pvVar6 = std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   *)((long)&nvalue.field_2 + 8),
                                  (size_type)
                                  files.
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
            cmsys::SystemTools::CollapseFullPath(&local_d8,pvVar6);
            pvVar6 = std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   *)((long)&nvalue.field_2 + 8),
                                  (size_type)
                                  files.
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
            std::__cxx11::string::operator=((string *)pvVar6,(string *)&local_d8);
            std::__cxx11::string::~string((string *)&local_d8);
          }
          if (files.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
            std::__cxx11::string::operator+=(local_b0,";");
          }
          pvVar6 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)((long)&nvalue.field_2 + 8),
                                (size_type)
                                files.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage);
          std::__cxx11::string::operator+=(local_b0,(string *)pvVar6);
        }
        pcVar7 = GetCMakeInstance(this);
        pcVar4 = (char *)std::__cxx11::string::c_str();
        cmake::AddCacheEntry(pcVar7,name,pcVar4,doc,val.field_2._12_4_);
        pcVar3 = GetState(this);
        pcVar4 = cmState::GetInitializedCacheValue(pcVar3,name);
        std::__cxx11::string::operator=((string *)local_50,pcVar4);
        val.field_2._M_local_buf[10] = '\x01';
        std::__cxx11::string::~string(local_b0);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)((long)&nvalue.field_2 + 8));
      }
    }
  }
  pcVar7 = GetCMakeInstance(this);
  if ((val.field_2._M_local_buf[10] & 1U) == 0) {
    local_168 = (char *)0x0;
  }
  else {
    local_168 = (char *)std::__cxx11::string::c_str();
  }
  cmake::AddCacheEntry(pcVar7,name,local_168,doc,val.field_2._12_4_);
  cmState::Snapshot::RemoveDefinition(&this->StateSnapshot,name);
  std::__cxx11::string::~string((string *)local_50);
  return;
}

Assistant:

void cmMakefile::AddCacheDefinition(const std::string& name, const char* value,
                                    const char* doc,
                                    cmState::CacheEntryType type,
                                    bool force)
{
  bool haveVal = value ? true : false;
  std::string val = haveVal ? value : "";
  const char* existingValue =
    this->GetState()->GetInitializedCacheValue(name);
  if(existingValue
      && (this->GetState()->GetCacheEntryType(name)
                                            == cmState::UNINITIALIZED))
    {
    // if this is not a force, then use the value from the cache
    // if it is a force, then use the value being passed in
    if(!force)
      {
      val = existingValue;
      haveVal = true;
      }
    if ( type == cmState::PATH || type == cmState::FILEPATH )
      {
      std::vector<std::string>::size_type cc;
      std::vector<std::string> files;
      std::string nvalue = "";
      cmSystemTools::ExpandListArgument(val, files);
      for ( cc = 0; cc < files.size(); cc ++ )
        {
        if(!cmSystemTools::IsOff(files[cc].c_str()))
          {
          files[cc] = cmSystemTools::CollapseFullPath(files[cc]);
          }
        if ( cc > 0 )
          {
          nvalue += ";";
          }
        nvalue += files[cc];
        }

      this->GetCMakeInstance()->AddCacheEntry(name, nvalue.c_str(), doc, type);
      val = this->GetState()->GetInitializedCacheValue(name);
      haveVal = true;
      }

    }
  this->GetCMakeInstance()->AddCacheEntry(name, haveVal ? val.c_str() : 0,
                                          doc, type);
  // if there was a definition then remove it
  this->StateSnapshot.RemoveDefinition(name);
}